

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonlinear_beamformer.cc
# Opt level: O3

void __thiscall
webrtc::NonlinearBeamformer::InitLowFrequencyCorrectionRanges(NonlinearBeamformer *this)

{
  size_t *v1;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  string *result;
  int iVar4;
  size_t sVar5;
  float fVar6;
  FatalMessage local_198;
  
  iVar4 = this->sample_rate_hz_;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)iVar4;
  fVar6 = floorf((float)SUB164((ZEXT816(0) << 0x40 | ZEXT816(0xc800)) / auVar1,0) + 0.5);
  sVar5 = (long)(fVar6 - 9.223372e+18) & (long)fVar6 >> 0x3f | (long)fVar6;
  v1 = &this->low_mean_start_bin_;
  this->low_mean_start_bin_ = sVar5;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)iVar4;
  fVar6 = floorf((float)SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x19000)) / auVar2,0) + 0.5);
  uVar3 = (long)(fVar6 - 9.223372e+18) & (long)fVar6 >> 0x3f | (long)fVar6;
  this->low_mean_end_bin_ = uVar3;
  local_198.stream_ = (ostringstream)0x0;
  local_198._1_3_ = 0;
  if (sVar5 == 0) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_int>
                       (v1,(uint *)&local_198,"low_mean_start_bin_ > 0U");
    if (result != (string *)0x0) {
      iVar4 = 0xf4;
      goto LAB_001750eb;
    }
    sVar5 = *v1;
    uVar3 = this->low_mean_end_bin_;
  }
  if (uVar3 <= sVar5) {
    result = rtc::MakeCheckOpString<unsigned_long,unsigned_long>
                       (v1,&this->low_mean_end_bin_,"low_mean_start_bin_ < low_mean_end_bin_");
    if (result != (string *)0x0) {
      iVar4 = 0xf5;
LAB_001750eb:
      rtc::FatalMessage::FatalMessage
                (&local_198,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/nonlinear_beamformer.cc"
                 ,iVar4,result);
      rtc::FatalMessage::~FatalMessage(&local_198);
    }
  }
  return;
}

Assistant:

void NonlinearBeamformer::InitLowFrequencyCorrectionRanges() {
  low_mean_start_bin_ = Round(kLowMeanStartHz * kFftSize / sample_rate_hz_);
  low_mean_end_bin_ = Round(kLowMeanEndHz * kFftSize / sample_rate_hz_);

  RTC_DCHECK_GT(low_mean_start_bin_, 0U);
  RTC_DCHECK_LT(low_mean_start_bin_, low_mean_end_bin_);
}